

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O1

Gia_Sim2_t * Gia_Sim2Create(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  int iVar1;
  int iVar2;
  Gia_Sim2_t *p;
  uint *puVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  long lVar6;
  int level;
  size_t __size;
  
  p = (Gia_Sim2_t *)calloc(1,0x30);
  p->pAig = pAig;
  p->pPars = pPars;
  iVar1 = pPars->nWords;
  p->nWords = iVar1;
  iVar2 = pAig->nObjs;
  __size = (long)(iVar2 * iVar1) << 2;
  puVar3 = (uint *)malloc(__size);
  p->pDataSim = puVar3;
  if (puVar3 == (uint *)0x0) {
    Abc_Print((int)__size,"Simulator could not allocate %.2f GB for simulation info.\n",
              (double)iVar2 * (double)iVar1 * 4.0 * 9.313225746154785e-10);
    Gia_Sim2Delete(p);
    p = (Gia_Sim2_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(400);
    pVVar4->pArray = piVar5;
    p->vClassOld = pVVar4;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    level = 400;
    piVar5 = (int *)malloc(400);
    pVVar4->pArray = piVar5;
    p->vClassNew = pVVar4;
    if (pPars->fVerbose != 0) {
      Abc_Print(level,"Memory: AIG = %7.2f MB.  SimInfo = %7.2f MB.\n",
                (double)iVar2 * 12.0 * 9.5367431640625e-07,
                (double)iVar1 * 4.0 * (double)iVar2 * 9.5367431640625e-07);
    }
    Gia_ManSetPhase(pAig);
    iVar1 = pAig->nObjs;
    if ((0 < (long)iVar1) && (pAig->pObjs != (Gia_Obj_t *)0x0)) {
      puVar3 = &pAig->pObjs->Value;
      lVar6 = 0;
      do {
        *puVar3 = (uint)lVar6;
        lVar6 = lVar6 + 1;
        puVar3 = puVar3 + 3;
      } while (iVar1 != lVar6);
    }
  }
  return p;
}

Assistant:

Gia_Sim2_t * Gia_Sim2Create( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    Gia_Sim2_t * p;
    Gia_Obj_t * pObj;
    int i;
    p = ABC_CALLOC( Gia_Sim2_t, 1 );
    p->pAig      = pAig;
    p->pPars     = pPars;
    p->nWords    = pPars->nWords;
    p->pDataSim  = ABC_ALLOC( unsigned, p->nWords * Gia_ManObjNum(p->pAig) );
    if ( !p->pDataSim  )
    { 
        Abc_Print( 1, "Simulator could not allocate %.2f GB for simulation info.\n", 
            4.0 * p->nWords * Gia_ManObjNum(p->pAig) / (1<<30) );
        Gia_Sim2Delete( p );
        return NULL;
    }
    p->vClassOld = Vec_IntAlloc( 100 );
    p->vClassNew = Vec_IntAlloc( 100 );
    if ( pPars->fVerbose )
        Abc_Print( 1, "Memory: AIG = %7.2f MB.  SimInfo = %7.2f MB.\n", 
            12.0*Gia_ManObjNum(p->pAig)/(1<<20), 4.0*p->nWords*Gia_ManObjNum(p->pAig)/(1<<20) );
    // prepare AIG
    Gia_ManSetPhase( pAig );
    Gia_ManForEachObj( pAig, pObj, i )
        pObj->Value = i;
    return p;
}